

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

char * helicsPublicationGetTag(HelicsPublication pub,char *tagname)

{
  PublicationObject *pPVar1;
  long in_RSI;
  string *info;
  PublicationObject *pubObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  Publication *this;
  char *in_stack_ffffffffffffffb8;
  Interface *in_stack_ffffffffffffffc0;
  __sv_type in_stack_ffffffffffffffc8;
  char *local_8;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffb8,(HelicsError *)in_stack_ffffffffffffffb0);
  if (pPVar1 == (PublicationObject *)0x0) {
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (in_stack_ffffffffffffffb0);
  }
  else {
    this = pPVar1->pubPtr;
    if (in_RSI == 0) {
      in_stack_ffffffffffffffc8 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
    }
    helics::Interface::getTag_abi_cxx11_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  }
  return local_8;
}

Assistant:

const char* helicsPublicationGetTag(HelicsPublication pub, const char* tagname)
{
    auto* pubObj = verifyPublication(pub, nullptr);
    if (pubObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = pubObj->pubPtr->getTag(AS_STRING_VIEW(tagname));
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}